

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1672::TestCase1672(TestCase1672 *this)

{
  TestCase1672 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x688,"legacy test: Encoding/GlobalConstants");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_005c1278;
  return;
}

Assistant:

TEST(Encoding, GlobalConstants) {
  EXPECT_EQ(12345u, test::GLOBAL_INT);
  EXPECT_EQ("foobar", test::GLOBAL_TEXT.get());
  EXPECT_EQ(54321, test::GLOBAL_STRUCT->getInt32Field());

  TestAllTypes::Reader reader = test::DERIVED_CONSTANT;

  EXPECT_EQ(12345, reader.getUInt32Field());
  EXPECT_EQ("foo", reader.getTextField());
  checkList(reader.getStructField().getTextList(), {"quux", "corge", "grault"});
  checkList(reader.getInt16List(), {11111, -11111});
  {
    List<TestAllTypes>::Reader listReader = reader.getStructList();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].getTextField());
    EXPECT_EQ("structlist 2", listReader[1].getTextField());
    EXPECT_EQ("structlist 3", listReader[2].getTextField());
  }
}